

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall pstore::broker::command_processor::scavenge(command_processor *this)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  not_null<const_char_*> nVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  __it;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar8;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  long *in_FS_OFFSET;
  tm tm;
  array<char,_100UL> buffer;
  time_t in_stack_ffffffffffffff08;
  not_null<const_char_*> local_d8;
  tm local_d0;
  char local_94 [99];
  undefined1 local_31;
  
  local_d8.ptr_ = "Scavenging zombie commands";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_d8);
  nVar4.ptr_ = local_d8.ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar8 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar8[1];
    for (puVar8 = (undefined8 *)*puVar8; puVar8 != puVar2; puVar8 = puVar8 + 1) {
      (**(code **)(*(long *)*puVar8 + 0x48))((long *)*puVar8,6,nVar4.ptr_);
    }
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->delete_threshold_).__r;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->cmds_mut_);
  if (iVar5 == 0) {
    __it._M_cur = (__node_type *)(this->cmds_)._M_h._M_before_begin._M_nxt;
    if (__it._M_cur != (__node_type *)0x0) {
      lVar3 = *in_FS_OFFSET;
      do {
        if (*(long *)((long)__it._M_cur + 0x18) < lVar1 * -1000000000 + lVar6) {
          gm_time(in_stack_ffffffffffffff08);
          sVar7 = strftime(local_94,100,"%FT%TZ",&local_d0);
          if (sVar7 == 0) {
            memcpy(local_94,"(unknown)",99);
          }
          local_31 = 0;
          pstore::details::log_destinations::__tls_init();
          if (*(long *)(lVar3 + -8) != 0) {
            pstore::details::log_destinations::__tls_init();
            puVar8 = *(undefined8 **)(lVar3 + -8);
            puVar2 = (undefined8 *)puVar8[1];
            for (puVar8 = (undefined8 *)*puVar8; puVar8 != puVar2; puVar8 = puVar8 + 1) {
              (**(code **)(*(long *)*puVar8 + 0x50))
                        ((long *)*puVar8,6,"Deleted old partial message. Arrived ",local_94);
            }
          }
          __it._M_cur = (__node_type *)
                        std::
                        _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::erase(&(this->cmds_)._M_h,__it._M_cur);
        }
        else {
          __it._M_cur = *__it._M_cur;
        }
      } while (__it._M_cur != (__node_type *)0x0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->cmds_mut_);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void command_processor::scavenge () {
            pstore::log (priority::info, "Scavenging zombie commands");

            // After this function is complete, no partial messages older than 'earliest time' will
            // be in the partial command map (cmds_).
            auto const earliest_time = std::chrono::system_clock::now () - delete_threshold_;

            // Remove all partial messages where the last piece of the message arrived before
            // earliest_time. It's most likely that the sending process gave up/crashed/lost
            // interest before sending the complete message.
            std::lock_guard<decltype (cmds_mut_)> const lock{cmds_mut_};
            auto const end = std::end (cmds_);
            auto it = std::begin (cmds_);
            while (it != end) {
                auto const arrival_time = it->second.arrive_time_;
                if (arrival_time < earliest_time) {
                    std::array<char, 100> buffer;
                    pstore::log (priority::info, "Deleted old partial message. Arrived ",
                                 time_to_string (arrival_time, &buffer));
                    it = cmds_.erase (it);
                } else {
                    ++it;
                }
            }
        }